

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

Int64FeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_int64type(FeatureType *this)

{
  bool bVar1;
  Int64FeatureType *this_00;
  FeatureType *this_local;
  
  bVar1 = has_int64type(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_int64type(this);
    this_00 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_00);
    (this->Type_).int64type_ = this_00;
  }
  return (this->Type_).int64type_;
}

Assistant:

inline ::CoreML::Specification::Int64FeatureType* FeatureType::mutable_int64type() {
  if (!has_int64type()) {
    clear_Type();
    set_has_int64type();
    Type_.int64type_ = new ::CoreML::Specification::Int64FeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.int64Type)
  return Type_.int64type_;
}